

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O0

monst * boomhit(int dx,int dy)

{
  char cVar1;
  char cVar2;
  boolean bVar3;
  schar sVar4;
  int iVar5;
  bool bVar6;
  monst *local_38;
  monst *mtmp;
  int local_20;
  int boom;
  int ct;
  int i;
  int dy_local;
  int dx_local;
  
  mtmp._4_4_ = 2;
  bhitpos.x = u.ux;
  bhitpos.y = u.uy;
  boom = 0;
  while ((boom < 8 && ((xdir[boom] != dx || (""[boom] != dy))))) {
    boom = boom + 1;
  }
  tmp_at(-2,0x40003);
  local_20 = 0;
  do {
    if (9 < local_20) {
LAB_0035407c:
      tmp_at(-6,0);
      return (monst *)0x0;
    }
    if (boom == 8) {
      boom = 0;
    }
    bVar6 = mtmp._4_4_ == 2;
    mtmp._4_4_ = 2;
    if (bVar6) {
      mtmp._4_4_ = 3;
    }
    tmp_at(-5,mtmp._4_4_ + 1U | 0x40000);
    cVar1 = xdir[boom];
    cVar2 = ""[boom];
    bhitpos.x = bhitpos.x + cVar1;
    bhitpos.y = bhitpos.y + cVar2;
    if ((level->monsters[bhitpos.x][bhitpos.y] != (monst *)0x0) &&
       ((*(uint *)&level->monsters[bhitpos.x][bhitpos.y]->field_0x60 >> 9 & 1) == 0)) {
      if ((level->monsters[bhitpos.x][bhitpos.y] == (monst *)0x0) ||
         ((*(uint *)&level->monsters[bhitpos.x][bhitpos.y]->field_0x60 >> 9 & 1) != 0)) {
        local_38 = (monst *)0x0;
      }
      else {
        local_38 = level->monsters[bhitpos.x][bhitpos.y];
      }
      m_respond(local_38);
      tmp_at(-6,0);
      return local_38;
    }
    if ((level->locations[bhitpos.x][bhitpos.y].typ < '\x11') ||
       (bVar3 = closed_door(level,(int)bhitpos.x,(int)bhitpos.y), bVar3 != '\0')) {
      bhitpos.x = bhitpos.x - cVar1;
      bhitpos.y = bhitpos.y - cVar2;
      goto LAB_0035407c;
    }
    if ((bhitpos.x == u.ux) && (bhitpos.y == u.uy)) {
      if ((u.uprops[0x25].intrinsic == 0) && (u.uprops[0x25].extrinsic == 0)) {
        iVar5 = rn2(0x14);
        sVar4 = acurr(3);
        if (iVar5 < sVar4) {
          tmp_at(-6,0);
          pline("You skillfully catch the boomerang.");
          _dy_local = &youmonst;
          return _dy_local;
        }
      }
      iVar5 = rnd(10);
      thitu(10,iVar5,(obj *)0x0,(obj *)0x0,(monst *)0x0,"boomerang");
      goto LAB_0035407c;
    }
    tmp_at((int)bhitpos.x,(int)bhitpos.y);
    (*windowprocs.win_delay)();
    if (local_20 % 5 != 0) {
      boom = boom + 1;
    }
    if (level->locations[bhitpos.x][bhitpos.y].typ == '\x1f') goto LAB_0035407c;
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

struct monst *boomhit(int dx, int dy)
{
	int i, ct;
	int boom = E_boomleft;	/* showsym[] index  */
	struct monst *mtmp;

	bhitpos.x = u.ux;
	bhitpos.y = u.uy;

	for (i = 0; i < 8; i++) if (xdir[i] == dx && ydir[i] == dy) break;
	tmp_at(DISP_FLASH, dbuf_effect(E_MISC, boom));
	for (ct = 0; ct < 10; ct++) {
		if (i == 8) i = 0;
		boom = (boom == E_boomleft) ? E_boomright : E_boomleft;
		tmp_at(DISP_CHANGE, dbuf_effect(E_MISC, boom));/* change glyph */
		dx = xdir[i];
		dy = ydir[i];
		bhitpos.x += dx;
		bhitpos.y += dy;
		if (MON_AT(level, bhitpos.x, bhitpos.y)) {
			mtmp = m_at(level, bhitpos.x,bhitpos.y);
			m_respond(mtmp);
			tmp_at(DISP_END, 0);
			return mtmp;
		}
		if (!ZAP_POS(level->locations[bhitpos.x][bhitpos.y].typ) ||
		   closed_door(level, bhitpos.x, bhitpos.y)) {
			bhitpos.x -= dx;
			bhitpos.y -= dy;
			break;
		}
		if (bhitpos.x == u.ux && bhitpos.y == u.uy) { /* ct == 9 */
			if (Fumbling || rn2(20) >= ACURR(A_DEX)) {
				/* We hit ourselves, but don't credit it like that;
				 * a boomerang with properties will eventually
				 * land in artifact_hit(), which can't handle
				 * self-hits. */
				thitu(10, rnd(10), NULL, NULL, NULL,
					"boomerang");
				break;
			} else {	/* we catch it */
				tmp_at(DISP_END, 0);
				pline("You skillfully catch the boomerang.");
				return &youmonst;
			}
		}
		tmp_at(bhitpos.x, bhitpos.y);
		win_delay_output();
		if (ct % 5 != 0) i++;
		if (IS_SINK(level->locations[bhitpos.x][bhitpos.y].typ))
			break;	/* boomerang falls on sink */
	}
	tmp_at(DISP_END, 0);	/* do not leave last symbol */
	return NULL;
}